

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmh.h
# Opt level: O1

size_t __thiscall
frozen::bits::pmh_tables<8ul,frozen::elsa<void>>::lookup<std::__cxx11::string,frozen::elsa<void>>
          (pmh_tables<8ul,frozen::elsa<void>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,elsa<void> *hasher)

{
  pointer pcVar1;
  size_type sVar2;
  uint uVar3;
  size_type sVar5;
  ulong uVar4;
  
  pcVar1 = (key->_M_dataplus)._M_p;
  sVar2 = key->_M_string_length;
  uVar4 = (*(ulong *)this ^ 0x811c9dc5) * 0x1000193;
  uVar3 = (uint)uVar4;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      uVar4 = ((long)pcVar1[sVar5] ^ uVar4) * 0x1000193;
      uVar3 = (uint)uVar4;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  uVar4 = *(ulong *)(this + (ulong)(uVar3 >> 5 & 0x38) + 8);
  if (-1 < (long)uVar4) {
    return uVar4;
  }
  uVar4 = (uVar4 ^ 0x811c9dc5) * 0x1000193;
  uVar3 = (uint)uVar4;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      uVar4 = ((long)pcVar1[sVar5] ^ uVar4) * 0x1000193;
      uVar3 = (uint)uVar4;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return *(size_t *)(this + (ulong)(uVar3 >> 5 & 0x38) + 0x48);
}

Assistant:

constexpr std::size_t lookup(const KeyType & key, const HasherType& hasher) const {
    auto const d = first_table_[hasher(key, static_cast<std::size_t>(first_seed_)) % M];
    if (!d.is_seed()) { return static_cast<std::size_t>(d.value()); } // this is narrowing std::uint64 -> std::size_t but should be fine
    else { return second_table_[hasher(key, static_cast<std::size_t>(d.value())) % M]; }
  }